

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O0

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::
write<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::Constant>
          (writer_base<cppwinrt::writer> *this,string_view *value,
          basic_string_view<char,_std::char_traits<char>_> *args,Constant *args_1)

{
  Constant *args_local_1;
  basic_string_view<char,_std::char_traits<char>_> *args_local;
  string_view *value_local;
  writer_base<cppwinrt::writer> *this_local;
  
  write_segment<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::Constant>
            (this,value,args,args_1);
  return;
}

Assistant:

void write(std::string_view const& value, Args const&... args)
        {
#if defined(_DEBUG)
            auto expected = count_placeholders(value);
            auto actual = sizeof...(Args);
            assert(expected == actual);
#endif
            write_segment(value, args...);
        }